

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffs.h
# Opt level: O0

void __thiscall libDAI::Diffs::Diffs(Diffs *this,long maxsize,double def)

{
  iterator iVar1;
  vector<double,_std::allocator<double>_> *in_RSI;
  undefined1 (*in_RDI) [16];
  size_type in_XMM0_Qa;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb8;
  
  *in_RDI = (undefined1  [16])0x0;
  *(undefined8 *)in_RDI[1] = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0xb227e3);
  *(vector<double,_std::allocator<double>_> **)(in_RDI[1] + 8) = in_RSI;
  *(size_type *)in_RDI[2] = in_XMM0_Qa;
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                    (in_RDI[2] + 8));
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                    (in_RDI + 3));
  std::vector<double,_std::allocator<double>_>::reserve(in_RSI,in_XMM0_Qa);
  iVar1 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffb8);
  *(double **)(in_RDI[2] + 8) = iVar1._M_current;
  iVar1 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffb8);
  *(double **)in_RDI[3] = iVar1._M_current;
  return;
}

Assistant:

Diffs(long maxsize, double def) : std::vector<double>(), _maxsize(maxsize), _def(def) { 
                this->reserve(_maxsize); 
                _pos = begin(); 
                _maxpos = begin(); 
            }